

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O3

void Dau_TablesSave(int nInputs,int nVars,Vec_Mem_t *vTtMem,Vec_Int_t *vNodSup,int nFronts,
                   abctime clk)

{
  FILE *__s;
  int iVar1;
  uint uVar2;
  int level;
  long lVar3;
  timespec ts;
  char FileName [100];
  timespec local_a8;
  char local_98 [104];
  
  uVar2 = 0;
  sprintf(local_98,"npn%d%d.ttd",(ulong)(uint)nInputs,nVars);
  __s = fopen(local_98,"wb");
  if (0 < vTtMem->nEntries) {
    iVar1 = 1 << ((char)nInputs - 6U & 0x1f);
    if (nInputs < 7) {
      iVar1 = 1;
    }
    do {
      fwrite(vTtMem->ppPages[uVar2 >> ((byte)vTtMem->LogPageSze & 0x1f)] +
             (long)(int)(vTtMem->PageMask & uVar2) * (long)vTtMem->nEntrySize,8,(long)iVar1,__s);
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < vTtMem->nEntries);
  }
  fwrite(vNodSup->pArray,4,(long)vNodSup->nSize,__s);
  fclose(__s);
  printf("Dumped file \"%s\" with %10d classes after exploring %10d frontiers.  ",local_98,
         (ulong)(uint)vNodSup->nSize,(ulong)(uint)nFronts);
  level = 3;
  iVar1 = clock_gettime(3,&local_a8);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 - clk) / 1000000.0);
  fflush(_stdout);
}

Assistant:

void Dau_TablesSave( int nInputs, int nVars, Vec_Mem_t * vTtMem, Vec_Int_t * vNodSup, int nFronts, abctime clk )
{
    FILE * pFile; 
    char FileName[100];
    int i, nWords = Abc_TtWordNum(nInputs);
    // NPN classes
    sprintf( FileName, "npn%d%d.ttd", nInputs, nVars );
    pFile = fopen( FileName, "wb" );
    for ( i = 0; i < Vec_MemEntryNum(vTtMem); i++ )
        fwrite( Vec_MemReadEntry(vTtMem, i), 8, nWords, pFile );
    fwrite( Vec_IntArray(vNodSup), 4, Vec_IntSize(vNodSup), pFile );
    fclose( pFile );
//    printf( "Dumped files with %10d classes after exploring %10d frontiers.\n", 
//        Vec_IntSize(vNodSup), nFronts );
    printf( "Dumped file \"%s\" with %10d classes after exploring %10d frontiers.  ", 
        FileName, Vec_IntSize(vNodSup), nFronts );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    fflush(stdout);
}